

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

cell * implementations::scheme::proc_mul(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  long lVar2;
  long in_RDX;
  long extraout_RDX;
  scheme *this;
  pointer pcVar3;
  string local_40;
  
  pcVar1 = (c->
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this = (scheme *)0x1;
  for (pcVar3 = (c->
                super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                )._M_impl.super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
    lVar2 = atol((pcVar3->val)._M_dataplus._M_p);
    this = (scheme *)((long)this * lVar2);
    in_RDX = extraout_RDX;
  }
  str_abi_cxx11_(&local_40,this,in_RDX);
  cell::cell(__return_storage_ptr__,Number,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

cell proc_mul(const cells & c)
{
	long n(1);
	for (cellit i = c.begin(); i != c.end(); ++i) n *= atol(i->val.c_str());
	return cell(Number, str(n));
}